

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O3

MatchResult __thiscall
r_exec::HLPController::check_predicted_evidences(HLPController *this,_Fact *target,_Fact **evidence)

{
  pointer pcVar1;
  byte bVar2;
  int iVar3;
  MatchResult MVar4;
  ulong uVar5;
  _Fact *p_Var6;
  list<r_exec::HLPController::PEEntry> *this_00;
  float fVar7;
  const_iterator cVar8;
  const_iterator local_58;
  float local_44;
  pthread_mutex_t *local_40;
  _Fact **local_38;
  
  local_40 = (pthread_mutex_t *)&this->predicted_evidences;
  local_38 = evidence;
  iVar3 = pthread_mutex_lock(local_40);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  uVar5 = (*Now)();
  local_58.super__iterator._cell = (this->predicted_evidences).evidences.used_cells_head;
  this_00 = &(this->predicted_evidences).evidences;
  cVar8._list = this_00;
  cVar8.super__iterator._cell = local_58.super__iterator._cell;
  local_58._list = this_00;
  do {
    if (local_58.super__iterator._cell == -1) {
      MVar4 = MATCH_FAILURE;
      p_Var6 = (_Fact *)0x0;
LAB_0017600a:
      *local_38 = p_Var6;
      pthread_mutex_unlock(local_40);
      return MVar4;
    }
    pcVar1 = ((cVar8._list)->cells).
             super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar2 = (**(code **)(**(long **)&pcVar1[cVar8.super__iterator._cell._cell].data.super_EEntry +
                        0x70))();
    if ((bVar2 | *(uint64_t *)
                  ((long)&pcVar1[cVar8.super__iterator._cell._cell].data.super_EEntry + 0x10) <
                 uVar5) == 1) {
      cVar8 = r_code::list<r_exec::HLPController::PEEntry>::erase(this_00,&local_58);
      local_58._list = cVar8._list;
    }
    else {
      MVar4 = _Fact::is_evidence(*(_Fact **)
                                  &((local_58._list)->cells).
                                   super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [local_58.super__iterator._cell].data.super_EEntry,target);
      if (MVar4 != MATCH_FAILURE) {
        local_44 = _Fact::get_cfd(target);
        fVar7 = _Fact::get_cfd(*(_Fact **)
                                &((local_58._list)->cells).
                                 super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
                                 ._M_impl.super__Vector_impl_data._M_start
                                 [local_58.super__iterator._cell].data.super_EEntry);
        if (local_44 < fVar7) {
          p_Var6 = *(_Fact **)
                    &((local_58._list)->cells).
                     super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_58.super__iterator._cell].data.
                     super_EEntry;
          goto LAB_0017600a;
        }
      }
      cVar8._list = local_58._list;
      cVar8.super__iterator._cell =
           ((local_58._list)->cells).
           super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start[local_58.super__iterator._cell].next;
    }
    local_58.super__iterator = cVar8.super__iterator._cell;
  } while( true );
}

Assistant:

MatchResult HLPController::check_predicted_evidences(_Fact *target, _Fact *&evidence)
{
    MatchResult r = MATCH_FAILURE;
    std::lock_guard<std::mutex> guard(predicted_evidences.mutex);
    uint64_t now = Now();
    r_code::list<PEEntry>::const_iterator e;

    for (e = predicted_evidences.evidences.begin(); e != predicted_evidences.evidences.end();) {
        if ((*e).is_too_old(now)) { // garbage collection. // garbage collection.
            e = predicted_evidences.evidences.erase(e);
        } else {
            if ((r = (*e).evidence->is_evidence(target)) != MATCH_FAILURE) {
                if (target->get_cfd() < (*e).evidence->get_cfd()) {
                    evidence = (*e).evidence;
                    return r;
                } else {
                    r = MATCH_FAILURE;
                }
            }

            ++e;
        }
    }

    evidence = nullptr;
    return r;
}